

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afdummy.c
# Opt level: O3

FT_Error af_dummy_hints_apply(FT_UInt glyph_index,AF_GlyphHints hints,FT_Outline *outline)

{
  FT_Pos FVar1;
  FT_Error FVar2;
  AF_Point_conflict pAVar3;
  AF_Point_conflict pAVar4;
  FT_Vector *pFVar5;
  char *pcVar6;
  char cVar7;
  
  FVar2 = af_glyph_hints_reload(hints,outline);
  if ((FVar2 == 0) && (0 < (long)hints->num_points)) {
    pAVar3 = hints->points;
    pAVar4 = pAVar3 + hints->num_points;
    pFVar5 = outline->points;
    pcVar6 = outline->tags;
    do {
      FVar1 = pAVar3->y;
      pFVar5->x = pAVar3->x;
      pFVar5->y = FVar1;
      cVar7 = '\x02' - ((pAVar3->flags & 2) == 0);
      if ((pAVar3->flags & 1) != 0) {
        cVar7 = '\0';
      }
      *pcVar6 = cVar7;
      pAVar3 = pAVar3 + 1;
      pFVar5 = pFVar5 + 1;
      pcVar6 = pcVar6 + 1;
    } while (pAVar3 < pAVar4);
  }
  return FVar2;
}

Assistant:

static FT_Error
  af_dummy_hints_apply( FT_UInt        glyph_index,
                        AF_GlyphHints  hints,
                        FT_Outline*    outline )
  {
    FT_Error  error;

    FT_UNUSED( glyph_index );


    error = af_glyph_hints_reload( hints, outline );
    if ( !error )
      af_glyph_hints_save( hints, outline );

    return error;
  }